

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

void initialise_ecurve(ec_curve *curve,mp_int *p,mp_int *d,mp_int *a,mp_int *nonsquare,mp_int *G_x,
                      mp_int *G_y,mp_int *G_order,uint log2_cofactor)

{
  EdwardsCurve *pEVar1;
  EdwardsPoint *pEVar2;
  mp_int *pmVar3;
  mp_int *G_x_local;
  mp_int *nonsquare_local;
  mp_int *a_local;
  mp_int *d_local;
  mp_int *p_local;
  ec_curve *curve_local;
  
  initialise_common(curve,EC_EDWARDS,p,1);
  pEVar1 = ecc_edwards_curve(p,d,a,nonsquare);
  (curve->field_6).e.ec = pEVar1;
  (curve->field_6).e.log2_cofactor = log2_cofactor;
  pEVar2 = ecc_edwards_point_new((curve->field_6).e.ec,G_x,G_y);
  (curve->field_6).e.G = pEVar2;
  pmVar3 = mp_copy(G_order);
  (curve->field_6).w.G_order = pmVar3;
  return;
}

Assistant:

static void initialise_ecurve(
    struct ec_curve *curve, mp_int *p, mp_int *d, mp_int *a,
    mp_int *nonsquare, mp_int *G_x, mp_int *G_y, mp_int *G_order,
    unsigned log2_cofactor)
{
    /* Ensure curve->fieldBytes is long enough to store an extra bit
     * for a compressed point */
    initialise_common(curve, EC_EDWARDS, p, 1);

    curve->e.ec = ecc_edwards_curve(p, d, a, nonsquare);
    curve->e.log2_cofactor = log2_cofactor;

    curve->e.G = ecc_edwards_point_new(curve->e.ec, G_x, G_y);
    curve->e.G_order = mp_copy(G_order);
}